

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O3

shared_ptr<const_rcg::Image> __thiscall rcg::ImageList::find(ImageList *this,uint64_t timestamp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  long *plVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long lVar4;
  shared_ptr<const_rcg::Image> sVar5;
  shared_ptr<const_rcg::Image> sVar6;
  shared_ptr<const_rcg::Image> sVar7;
  
  lVar4 = *(long *)(timestamp + 0x10) - *(long *)(timestamp + 8);
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    plVar3 = (long *)(*(long *)(timestamp + 8) + 8);
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar3[-1] + 8) == in_RDX._M_pi) {
        this->maxsize = plVar3[-1];
        psVar2 = (pointer)*plVar3;
        (this->list).
        super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar2;
        if (psVar2 != (pointer)0x0) {
          if (__libc_single_threaded != '\0') {
            p_Var1 = &(psVar2->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
            sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)this;
            return (shared_ptr<const_rcg::Image>)
                   sVar6.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
          }
          LOCK();
          p_Var1 = &(psVar2->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
          sVar7.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          sVar7.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this;
          return (shared_ptr<const_rcg::Image>)
                 sVar7.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
        }
        goto LAB_0012d299;
      }
      plVar3 = plVar3 + 2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  this->maxsize = 0;
  (this->list).
  super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0012d299:
  sVar5.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_rcg::Image>)
         sVar5.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp) const
{
  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getTimestampNS() == timestamp)
    {
      return list[i];
    }
  }

  return std::shared_ptr<const Image>();
}